

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_queue.cpp
# Opt level: O1

void use_queue(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  time_t tVar4;
  Item *pIVar5;
  long lVar6;
  EVP_PKEY_CTX *ctx;
  char *pcVar7;
  EVP_PKEY_CTX *pEVar8;
  int iVar9;
  int hours;
  Item temp;
  double customers_per_hour;
  int qs;
  Queue queue;
  int local_74;
  Customer local_70;
  double local_60;
  double local_58;
  int local_4c;
  Queue local_48;
  
  time((time_t *)0x0);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ICBC Teller\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter maximum size of queue:",0x1c);
  std::istream::operator>>((istream *)&std::cin,&local_4c);
  L12_2::Queue::Queue(&local_48,local_4c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the number of simulation hours: ",0x26);
  std::istream::operator>>((istream *)&std::cin,&local_74);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the average number of customer per hour: ",0x2f);
  std::istream::_M_extract<double>((double *)&std::cin);
  local_60 = 60.0 / local_58;
  local_70._process_time = 0;
  local_70._arrive_time = 0;
  if (0 < local_74) {
    pEVar8 = (EVP_PKEY_CTX *)0x1;
    if (1 < local_74 * 0x3c) {
      pEVar8 = (EVP_PKEY_CTX *)(ulong)(uint)(local_74 * 0x3c);
    }
    ctx = (EVP_PKEY_CTX *)0x0;
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"====> minute=",0xd);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)ctx);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," <====\n",7);
      iVar2 = rand();
      if (((double)iVar2 * local_60) / 2147483647.0 < 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"new customer incoming!\n",0x17);
        bVar1 = L12_2::Queue::is_full(&local_48);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Current queue(size=",0x13);
          iVar2 = L12_2::Queue::get_size(&local_48);
          poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          lVar6 = 0x1d;
          pcVar7 = ") is full, had to go away...\n";
        }
        else {
          L12_2::Customer::init(&local_70,ctx);
          L12_2::Queue::enqueue(&local_48,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Added to the queue(size=",0x18);
          iVar2 = L12_2::Queue::get_size(&local_48);
          poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          lVar6 = 2;
          pcVar7 = ")\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar6);
      }
      bVar1 = L12_2::Queue::is_empty(&local_48);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"no customer, rest...\n",0x15);
      }
      else {
        if (iVar9 == 0) {
          pIVar5 = L12_2::Queue::first(&local_48);
          iVar9 = pIVar5->_process_time;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"now begin to handle customer. current queue(size=",0x31)
          ;
          iVar2 = L12_2::Queue::get_size(&local_48);
          poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"). it takes ",0xc);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," minutes. \n",0xb);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time pass...",0xc)
        ;
        iVar2 = iVar9 + -1;
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        bVar1 = iVar9 < 2;
        iVar9 = iVar2;
        if (bVar1) {
          L12_2::Queue::dequeue(&local_48,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ok, successfully handled one customer. current queue(size=",0x3a);
          iVar2 = L12_2::Queue::get_size(&local_48);
          poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
        }
      }
      ctx = ctx + 1;
    } while (pEVar8 != ctx);
  }
  L12_2::Queue::~Queue(&local_48);
  return;
}

Assistant:

void use_queue() {
    using std::cout;
    using std::endl;
    using std::cin;
    using namespace L12_2;

    //  std::time: get current second count from 1970.1.1
    std::cout << std::time(nullptr) << "\n";

    //  以当前秒数作为伪随机种子
    std::srand(std::time(nullptr));

    cout << "ICBC Teller\n";
    cout << "Enter maximum size of queue:";
    int qs;
    cin >> qs;
    Queue queue(qs);

    cout << "Enter the number of simulation hours: ";
    int hours;
    cin >> hours;
    long minutes = hours * MINUTES_PER_HOUR;

    cout << "Enter the average number of customer per hour: ";
    double customers_per_hour;
    cin >> customers_per_hour;
    //  平均每个人耗时多少分钟
    double average_customer_time_spent = MINUTES_PER_HOUR / customers_per_hour;

    Item temp;
    int t = 0;
    //  队列中正在等待的人的剩余等待时间
    int remain_wait_time = 0;
    //  因队列满了，被赶走的人
    int num_leave = 0;
    //  总共的加入队列的顾客
    int num_queued = 0;
    for (t = 0; t < minutes; t++) {
        //  随机生成是否有新客户
        cout << "====> minute=" << t << " <====\n";
        if (check_new_customer(average_customer_time_spent)) {
            cout << "new customer incoming!\n";
            if (queue.is_full()) {
                //  队列满了，该顾客只能走了
                num_leave++;
                cout << "Current queue(size=" << queue.get_size() << ") is full, had to go away...\n";
            } else {
                num_queued++;
                temp.init(t);
                queue.enqueue(temp);
                cout << "Added to the queue(size=" << queue.get_size() << ")\n";
            }
        }
        if (queue.is_empty()) {
            cout << "no customer, rest...\n";
            continue;
        }
        //  应该开始处理队列里的第一个人
        if (remain_wait_time == 0) {
            remain_wait_time = queue.first().get_process_time();
            cout << "now begin to handle customer. current queue(size=" << queue.get_size() << "). it takes " << remain_wait_time << " minutes. \n";
        }
        //  time pass...
        remain_wait_time--;
        cout << "Time pass..." << remain_wait_time << "\n";
        //  如果队列非空，且队列中当前等待的人剩余等待时间已满，那么该 shift 了...
        if (remain_wait_time <= 0) {
            queue.dequeue(temp);
            //  设置为下一个顾客的等待时间
//            remain_wait_time = temp.get_process_time();
            cout << "ok, successfully handled one customer. current queue(size=" << queue.get_size() << ")\n";
        }
    }
}